

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

void * deMemPool_alloc(deMemPool *pool,size_t numBytes)

{
  deMemPoolUtil *pdVar1;
  void *pvVar2;
  
  pvVar2 = deMemPool_allocInternal(pool,numBytes,8);
  if ((pvVar2 == (void *)0x0) && (pdVar1 = pool->util, pdVar1 != (deMemPoolUtil *)0x0)) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return pvVar2;
}

Assistant:

void* deMemPool_alloc (deMemPool* pool, size_t numBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	ptr = deMemPool_allocInternal(pool, numBytes, DE_POOL_DEFAULT_ALLOC_ALIGNMENT);
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}